

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

OrigClOrdID * __thiscall
Application::queryOrigClOrdID(OrigClOrdID *__return_storage_ptr__,Application *this)

{
  ostream *poVar1;
  undefined1 local_38 [8];
  string value;
  Application *this_local;
  
  value.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar1,"OrigClOrdID: ");
  std::operator>>((istream *)&std::cin,(string *)local_38);
  FIX::OrigClOrdID::OrigClOrdID(__return_storage_ptr__,(STRING *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

FIX::OrigClOrdID Application::queryOrigClOrdID() {
  std::string value;
  std::cout << std::endl << "OrigClOrdID: ";
  std::cin >> value;
  return FIX::OrigClOrdID(value);
}